

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-token.c
# Opt level: O2

int fy_tag_token_format_internal(fy_token *fyt,void *out,size_t *outszp)

{
  uint uVar1;
  fy_token *fyt_00;
  char *pcVar2;
  char *pcVar3;
  char *s;
  int iVar4;
  long lVar5;
  int _l;
  int iVar6;
  char *pcVar7;
  int iVar8;
  long local_50;
  int code_length;
  uint8_t code [4];
  size_t handle_size;
  
  iVar8 = 0;
  if ((fyt != (fy_token *)0x0) && (fyt->type == FYTT_TAG)) {
    if (out == (void *)0x0) {
      local_50 = 0;
    }
    else {
      if (*outszp == 0) {
        return 0;
      }
      local_50 = *outszp + (long)out;
    }
    fyt_00 = (fyt->field_9).tag.fyt_td;
    iVar8 = -1;
    if ((fyt_00 != (fy_token *)0x0) &&
       (pcVar2 = fy_tag_directive_token_prefix(fyt_00,&handle_size), pcVar2 != (char *)0x0)) {
      pcVar3 = fy_atom_data(&fyt->handle);
      pcVar3 = pcVar3 + (ulong)(fyt->field_9).tag_directive.uri_length +
                        (ulong)(fyt->field_9).tag_directive.tag_length;
      uVar1 = (fyt->field_9).tag.suffix_length;
      iVar8 = (int)handle_size;
      if (iVar8 != 0 && out != (void *)0x0) {
        if (local_50 - (long)out < (long)iVar8) {
          iVar8 = (int)(local_50 - (long)out);
        }
        memcpy(out,pcVar2,(long)iVar8);
        out = (void *)((long)out + (long)iVar8);
      }
      pcVar2 = pcVar3 + uVar1;
      while (iVar8 = (int)handle_size, pcVar3 < pcVar2) {
        s = (char *)memchr(pcVar3,0x25,(long)pcVar2 - (long)pcVar3);
        pcVar7 = s;
        if (s == (char *)0x0) {
          pcVar7 = pcVar2;
        }
        iVar6 = (int)((long)pcVar7 - (long)pcVar3);
        if ((out != (void *)0x0) && (iVar6 != 0)) {
          lVar5 = local_50 - (long)out;
          if ((long)iVar6 <= local_50 - (long)out) {
            lVar5 = (long)pcVar7 - (long)pcVar3;
          }
          memcpy(out,pcVar3,(long)(int)lVar5);
          out = (void *)((long)out + (long)(int)lVar5);
        }
        iVar8 = iVar8 + iVar6;
        if (s == (char *)0x0) {
          return iVar8;
        }
        code_length = 4;
        pcVar3 = fy_uri_esc(s,(long)pcVar2 - (long)s,code,&code_length);
        iVar6 = code_length;
        if (pcVar3 == (char *)0x0) {
          return iVar8;
        }
        if (code_length != 0 && out != (void *)0x0) {
          iVar4 = (int)(local_50 - (long)out);
          if ((long)code_length <= local_50 - (long)out) {
            iVar4 = code_length;
          }
          memcpy(out,code,(long)iVar4);
          out = (void *)((long)out + (long)iVar4);
        }
        handle_size = (size_t)(uint)(iVar8 + iVar6);
      }
    }
  }
  return iVar8;
}

Assistant:

static int fy_tag_token_format_internal(const struct fy_token *fyt, void *out, size_t *outszp) {
    char *o = NULL, *oe = NULL;
    size_t outsz;
    const char *handle, *suffix;
    size_t handle_size, suffix_size;
    int len, code_length, rlen;
    uint8_t code[4];
    const char *t, *s, *e;

    if (!fyt || fyt->type != FYTT_TAG)
        return 0;

    if (out && *outszp <= 0)
        return 0;

    if (out) {
        outsz = *outszp;
        o = out;
        oe = out + outsz;
    }

    if (!fyt->tag.fyt_td)
        return -1;

    handle = fy_tag_directive_token_prefix(fyt->tag.fyt_td, &handle_size);
    if (!handle)
        return -1;

    suffix = fy_atom_data(&fyt->handle) + fyt->tag.skip + fyt->tag.handle_length;
    suffix_size = fyt->tag.suffix_length;

#define O_CPY(_src, _len) \
    do { \
        int _l = (_len); \
        if (o && _l) { \
            int _cl = _l; \
            if (_cl > (oe - o)) \
                _cl = oe - o; \
            memcpy(o, (_src), _cl); \
            o += _cl; \
        } \
        len += _l; \
    } while(0)

    len = 0;
    O_CPY(handle, handle_size);

    /* escape suffix as a URI */
    s = suffix;
    e = s + suffix_size;
    while (s < e) {
        /* find next escape */
        t = memchr(s, '%', e - s);
        rlen = (t ? t : e) - s;
        O_CPY(s, rlen);

        /* end of string */
        if (!t)
            break;
        s = t;

        code_length = sizeof(code);
        t = fy_uri_esc(s, e - s, code, &code_length);
        if (!t)
            break;

        /* output escaped utf8 */
        O_CPY(code, code_length);
        s = t;
    }

#undef O_CPY
    return len;

}